

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_set_byte_Test::TestBody
          (ByteBufferTest_test_set_byte_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ByteBuffer buff;
  Message local_58;
  AssertHelper local_50;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  ByteBuffer local_38 [48];
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_38,5);
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)local_38,'\0');
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)local_38,'\x01');
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)local_38,'\x02');
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)local_38,'\x03');
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)local_38,'\x04');
  local_58.ss_.ptr_._0_4_ = 5;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::CmpHelperEQ<int,unsigned_char>
            (local_48,"5","buff.ReadByte()",(int *)&local_58,(uchar *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message(&local_58);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xce,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ss_.ptr_._0_4_ = 3;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::CmpHelperEQ<int,unsigned_char>
            (local_48,"3","buff.ReadByte()",(int *)&local_58,(uchar *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message(&local_58);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xcf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ss_.ptr_._0_4_ = 1;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::CmpHelperEQ<int,unsigned_char>
            (local_48,"1","buff.ReadByte()",(int *)&local_58,(uchar *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message(&local_58);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xd0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ss_.ptr_._0_4_ = 7;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::CmpHelperEQ<int,unsigned_char>
            (local_48,"7","buff.ReadByte()",(int *)&local_58,(uchar *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message(&local_58);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xd1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ss_.ptr_._0_4_ = 9;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::ReadByte();
  testing::internal::CmpHelperEQ<int,unsigned_char>
            (local_48,"9","buff.ReadByte()",(int *)&local_58,(uchar *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message(&local_58);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_38);
  return;
}

Assistant:

TEST(ByteBufferTest, test_set_byte)
{
    ByteBuffer buff(5);
    buff.SetByte(0, 5);
    buff.SetByte(1, 3);
    buff.SetByte(2, 1);
    buff.SetByte(3, 7);
    buff.SetByte(4, 9);
    EXPECT_EQ(5, buff.ReadByte());
    EXPECT_EQ(3, buff.ReadByte());
    EXPECT_EQ(1, buff.ReadByte());
    EXPECT_EQ(7, buff.ReadByte());
    EXPECT_EQ(9, buff.ReadByte());
}